

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestRebuildOrderOnlyDeps::Run(BuildTestRebuildOrderOnlyDeps *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  reference pvVar7;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  undefined4 local_50;
  ManifestParserOptions local_4c [3];
  int local_34;
  undefined1 local_30 [4];
  int fail_count;
  string err;
  BuildTestRebuildOrderOnlyDeps *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  local_34 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(local_4c);
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cc\n  command = cc $in\nrule true\n  command = true\nbuild oo.h: cc oo.h.in\nbuild foo.o: cc foo.c || oo.h\n"
              ,local_4c[0]);
  iVar2 = local_34;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo.c",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_70,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"oo.h.in",&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_c0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"foo.o",&local_111);
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_110,(string *)local_30);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x441,"builder_.AddTarget(\"foo.o\", &err)");
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    pTVar1 = g_current_test;
    bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_30);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x442,"builder_.Build(&err)");
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x443,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar6 == 2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x444,"2u == command_runner_.commands_ran_.size()");
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->super_BuildTest).command_runner_.commands_ran_);
        State::Reset(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"foo.o",&local_139);
        pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_138,(string *)local_30)
        ;
        testing::Test::Check
                  (pTVar1,pNVar5 != (Node *)0x0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x449,"builder_.AddTarget(\"foo.o\", &err)");
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        pTVar1 = g_current_test;
        bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x44a,"\"\" == err");
        pTVar1 = g_current_test;
        bVar3 = Builder::AlreadyUpToDate(&(this->super_BuildTest).builder_);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,1099,"builder_.AlreadyUpToDate()");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"oo.h",&local_161);
        VirtualFileSystem::RemoveFile(&(this->super_BuildTest).fs_,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->super_BuildTest).command_runner_.commands_ran_);
        State::Reset(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"foo.o",&local_189);
        pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_188,(string *)local_30)
        ;
        testing::Test::Check
                  (pTVar1,pNVar5 != (Node *)0x0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x451,"builder_.AddTarget(\"foo.o\", &err)");
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
        pTVar1 = g_current_test;
        bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_30);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x452,"builder_.Build(&err)");
        pTVar1 = g_current_test;
        bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30);
        bVar3 = testing::Test::Check
                          (pTVar1,bVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x453,"\"\" == err");
        pTVar1 = g_current_test;
        if (bVar3) {
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
          bVar3 = testing::Test::Check
                            (pTVar1,sVar6 == 1,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x454,"1u == command_runner_.commands_ran_.size()");
          pTVar1 = g_current_test;
          if (bVar3) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,0);
            bVar3 = std::operator==("cc oo.h.in",pvVar7);
            bVar3 = testing::Test::Check
                              (pTVar1,bVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0x455,"\"cc oo.h.in\" == command_runner_.commands_ran_[0]");
            if (bVar3) {
              VirtualFileSystem::Tick(&(this->super_BuildTest).fs_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1b0,"oo.h.in",&local_1b1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9)
              ;
              VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_1b0,&local_1d8);
              std::__cxx11::string::~string((string *)&local_1d8);
              std::allocator<char>::~allocator(&local_1d9);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::allocator<char>::~allocator(&local_1b1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&(this->super_BuildTest).command_runner_.commands_ran_);
              State::Reset(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_);
              pTVar1 = g_current_test;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_200,"foo.o",&local_201);
              pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_200,
                                          (string *)local_30);
              testing::Test::Check
                        (pTVar1,pNVar5 != (Node *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x45d,"builder_.AddTarget(\"foo.o\", &err)");
              std::__cxx11::string::~string((string *)&local_200);
              std::allocator<char>::~allocator(&local_201);
              pTVar1 = g_current_test;
              bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_30);
              testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x45e,"builder_.Build(&err)");
              pTVar1 = g_current_test;
              bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_30);
              bVar3 = testing::Test::Check
                                (pTVar1,bVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                 ,0x45f,"\"\" == err");
              pTVar1 = g_current_test;
              if (bVar3) {
                sVar6 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
                bVar3 = testing::Test::Check
                                  (pTVar1,sVar6 == 1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                   ,0x460,"1u == command_runner_.commands_ran_.size()");
                pTVar1 = g_current_test;
                if (bVar3) {
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](&(this->super_BuildTest).command_runner_.commands_ran_,0);
                  bVar3 = std::operator==("cc oo.h.in",pvVar7);
                  bVar3 = testing::Test::Check
                                    (pTVar1,bVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                     ,0x461,"\"cc oo.h.in\" == command_runner_.commands_ran_[0]");
                  if (bVar3) {
                    local_50 = 0;
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    local_50 = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  local_50 = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                local_50 = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              local_50 = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_50 = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_50 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_50 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_50 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_50 = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(BuildTest, RebuildOrderOnlyDeps) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n  command = cc $in\n"
"rule true\n  command = true\n"
"build oo.h: cc oo.h.in\n"
"build foo.o: cc foo.c || oo.h\n"));

  fs_.Create("foo.c", "");
  fs_.Create("oo.h.in", "");

  // foo.o and order-only dep dirty, build both.
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, command_runner_.commands_ran_.size());

  // all clean, no rebuild.
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  // order-only dep missing, build it only.
  fs_.RemoveFile("oo.h");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  ASSERT_EQ("cc oo.h.in", command_runner_.commands_ran_[0]);

  fs_.Tick();

  // order-only dep dirty, build it only.
  fs_.Create("oo.h.in", "");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  ASSERT_EQ("cc oo.h.in", command_runner_.commands_ran_[0]);
}